

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenTry(BinaryenModuleRef module,char *name,BinaryenExpressionRef body,char **catchTags,
           BinaryenIndex numCatchTags,BinaryenExpressionRef *catchBodies,
           BinaryenIndex numCatchBodies,char *delegateTarget)

{
  char *__s;
  Try *this;
  IString *pIVar1;
  undefined1 reuse;
  Expression *item;
  MixedArena *this_00;
  ulong uVar2;
  string_view sVar3;
  string_view s;
  string_view s_00;
  optional<wasm::Type> type_;
  
  reuse = SUB81(catchTags,0);
  this_00 = &module->allocator;
  item = (Expression *)0x78;
  this = (Try *)MixedArena::allocSpace(this_00,0x78,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id = TryId;
  (this->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0;
  (this->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (this->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements = 0
  ;
  (this->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id = 0;
  (this->name).super_IString.str._M_len = 0;
  (this->name).super_IString.str._M_str = (char *)0x0;
  (this->catchTags).allocator = this_00;
  (this->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  data = (Expression **)0x0;
  (this->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (this->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (this->catchBodies).allocator = this_00;
  (this->delegateTarget).super_IString.str._M_len = 0;
  (this->delegateTarget).super_IString.str._M_str = (char *)0x0;
  if (name != (char *)0x0) {
    pIVar1 = (IString *)strlen(name);
    sVar3._M_str = (char *)0x0;
    sVar3._M_len = (size_t)name;
    sVar3 = wasm::IString::interned(pIVar1,sVar3,(bool)reuse);
    (this->name).super_IString.str = sVar3;
    item = (Expression *)name;
  }
  this->body = body;
  if (numCatchTags != 0) {
    uVar2 = 0;
    do {
      __s = catchTags[uVar2];
      pIVar1 = (IString *)strlen(__s);
      s._M_str = (char *)0x0;
      s._M_len = (size_t)__s;
      sVar3 = wasm::IString::interned(pIVar1,s,(bool)reuse);
      item = (Expression *)sVar3._M_len;
      ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
                (&(this->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                 (Name)sVar3);
      uVar2 = uVar2 + 1;
    } while (numCatchTags != uVar2);
  }
  if (numCatchBodies != 0) {
    uVar2 = 0;
    do {
      item = catchBodies[uVar2];
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(this->catchBodies).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,item);
      uVar2 = uVar2 + 1;
    } while (numCatchBodies != uVar2);
  }
  if (delegateTarget != (char *)0x0) {
    pIVar1 = (IString *)strlen(delegateTarget);
    s_00._M_str = (char *)0x0;
    s_00._M_len = (size_t)delegateTarget;
    sVar3 = wasm::IString::interned(pIVar1,s_00,(bool)reuse);
    (this->delegateTarget).super_IString.str = sVar3;
    item = (Expression *)delegateTarget;
  }
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)item;
  wasm::Try::finalize(this,type_);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenTry(BinaryenModuleRef module,
                                  const char* name,
                                  BinaryenExpressionRef body,
                                  const char** catchTags,
                                  BinaryenIndex numCatchTags,
                                  BinaryenExpressionRef* catchBodies,
                                  BinaryenIndex numCatchBodies,
                                  const char* delegateTarget) {
  auto* ret = ((Module*)module)->allocator.alloc<Try>();
  if (name) {
    ret->name = name;
  }
  ret->body = (Expression*)body;
  for (BinaryenIndex i = 0; i < numCatchTags; i++) {
    ret->catchTags.push_back(catchTags[i]);
  }
  for (BinaryenIndex i = 0; i < numCatchBodies; i++) {
    ret->catchBodies.push_back((Expression*)catchBodies[i]);
  }
  if (delegateTarget) {
    ret->delegateTarget = delegateTarget;
  }
  ret->finalize();
  return static_cast<Expression*>(ret);
}